

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::formatToName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,deUint32 format)

{
  bool bVar1;
  deUint32 internalFormat;
  string sStack_88;
  string enumName;
  code *local_48;
  deUint32 local_40;
  string local_38 [32];
  
  internalFormat = (deUint32)this;
  enumName._M_dataplus._M_p = (pointer)&enumName.field_2;
  enumName._M_string_length = 0;
  enumName.field_2._M_local_buf[0] = '\0';
  bVar1 = glu::isCompressedFormat(internalFormat);
  local_40 = internalFormat;
  if (bVar1) {
    local_48 = glu::getCompressedTextureFormatName;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&sStack_88,&local_48);
    std::__cxx11::string::substr((ulong)local_38,(ulong)&sStack_88);
  }
  else {
    local_48 = glu::getUncompressedTextureFormatName;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&sStack_88,&local_48);
    std::__cxx11::string::substr((ulong)local_38,(ulong)&sStack_88);
  }
  std::__cxx11::string::operator=((string *)&enumName,local_38);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string((string *)&sStack_88);
  de::toLower(__return_storage_ptr__,&enumName);
  std::__cxx11::string::~string((string *)&enumName);
  return __return_storage_ptr__;
}

Assistant:

string formatToName (deUint32 format)
{
	string enumName;

	if (glu::isCompressedFormat(format))
		enumName = glu::getCompressedTextureFormatStr(format).toString().substr(14); // Strip GL_COMPRESSED_
	else
		enumName = glu::getUncompressedTextureFormatStr(format).toString().substr(3); // Strip GL_

	return de::toLower(enumName);
}